

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O0

int __thiscall ev3dev::device::device_index(device *this)

{
  bool bVar1;
  ulong uVar2;
  undefined8 uVar3;
  reference pcVar4;
  long in_RDI;
  const_reverse_iterator it;
  uint f;
  error_code in_stack_00000038;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffa8;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffb0;
  int local_28;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    uVar3 = __cxa_allocate_exception(0x20);
    std::make_error_code(0);
    std::system_error::system_error(_f,in_stack_00000038,_it);
    __cxa_throw(uVar3,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  if (*(int *)(in_RDI + 0x20) < 0) {
    local_28 = 1;
    *(undefined4 *)(in_RDI + 0x20) = 0;
    std::__cxx11::string::rbegin();
    while( true ) {
      std::__cxx11::string::rend();
      bVar1 = std::operator!=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      if (!bVar1) break;
      pcVar4 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(in_stack_ffffffffffffffb0);
      if (*pcVar4 != '/') {
        pcVar4 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*(in_stack_ffffffffffffffb0);
        if ((*pcVar4 < '0') ||
           (pcVar4 = std::
                     reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator*(in_stack_ffffffffffffffb0), '9' < *pcVar4)) break;
        pcVar4 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*(in_stack_ffffffffffffffb0);
        *(int *)(in_RDI + 0x20) = (*pcVar4 + -0x30) * local_28 + *(int *)(in_RDI + 0x20);
        local_28 = local_28 * 10;
      }
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(in_stack_ffffffffffffffb0);
    }
  }
  return *(int *)(in_RDI + 0x20);
}

Assistant:

int device::device_index() const {
    using namespace std;

    if (_path.empty())
        throw system_error(make_error_code(errc::function_not_supported), "no device connected");

    if (_device_index < 0) {
        unsigned f = 1;
        _device_index = 0;
        for (auto it=_path.rbegin(); it!=_path.rend(); ++it) {
            if(*it =='/')
                continue;		
            if ((*it < '0') || (*it > '9'))
                break;

            _device_index += (*it -'0') * f;
            f *= 10;
        }
    }

    return _device_index;
}